

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

void __thiscall
sisl::array_n<float,_3,_std::allocator<float>_>::_alloc
          (array_n<float,_3,_std::allocator<float>_> *this,uint n)

{
  float *pfVar1;
  ulong __n;
  ulong uVar2;
  
  if (n == 0) {
    pfVar1 = (float *)0x0;
  }
  else {
    __n = (ulong)n;
    pfVar1 = __gnu_cxx::new_allocator<float>::allocate((new_allocator<float> *)this,__n,(void *)0x0)
    ;
    this->first = pfVar1;
    for (uVar2 = 0; __n != uVar2; uVar2 = uVar2 + 1) {
      pfVar1[uVar2] = 0.0;
    }
    this->last = pfVar1 + __n;
  }
  this->_array = pfVar1;
  return;
}

Assistant:

void _alloc(unsigned int n) {
            size_type i;
            if(n == 0) {
                this->_array = nullptr;
                return;
            }

            this->first = Allocator::allocate(n);
            try {
                for (i = 0; i < n; ++i) {
                    Allocator::construct(first + i, T());
                }
            }catch(...) {
                for(size_type j = 0; j < i; ++j) {
                     Allocator::destroy(first + j);
                }
                Allocator::deallocate(first, n);
                throw;
            }
            last = first + i;
            this->_array = static_cast<T *>(first);
        }